

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O2

AutorunType __thiscall DiskGen::GetAutorun(DiskGen *this,char *buffer,uint size_of_buffer)

{
  bool bVar1;
  bool bVar2;
  char **__s1;
  pointer pRVar3;
  AutorunType AVar4;
  bool bVar5;
  int i;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  pointer pRVar9;
  pointer pbVar10;
  byte local_ad;
  value_type local_a8;
  int local_8c;
  vector<Rule,_std::allocator<Rule>_> rule_list;
  AutorunType ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filename_vector;
  string disk_filename;
  
  IDisk::GetCAT_abi_cxx11_(&filename_vector,this->disk_,&ret,0);
  if (this->disk_ == (IDisk *)0x0) {
    pcVar8 = "";
  }
  else {
    pcVar8 = (this->disk_->current_disk_path_)._M_dataplus._M_p;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&disk_filename,pcVar8,(allocator<char> *)&rule_list);
  rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.name_._0_5_ = 0x1a9698;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96a2;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a9698;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96a2;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96b0;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96b0;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96bc;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96bc;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96bc;
  local_a8._5_4_ = 0xb3000000;
  local_a8.ext_._1_4_ = 0x1ac5;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96c4;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96c4;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96d0;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96d0;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96d8;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96d8;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96d8;
  local_a8._5_4_ = 0xb3000000;
  local_a8.ext_._1_4_ = 0x1ac5;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96e2;
  local_a8._5_4_ = 0xec000000;
  local_a8.ext_._1_4_ = 0x1aac;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  local_a8.name_._0_5_ = 0x1a96e2;
  local_a8._5_4_ = 0xac000000;
  local_a8.ext_._1_4_ = 0x1a96;
  local_a8.ext_._5_2_ = 0;
  local_a8.ext_._7_1_ = 0;
  local_a8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&rule_list,&local_a8);
  pRVar3 = rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  bVar2 = false;
  pRVar9 = rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data
           ._M_start;
  while ((pRVar9 != pRVar3 && (!bVar2))) {
    bVar5 = FindName(&filename_vector,pRVar9->name_,pRVar9->ext_);
    if (bVar5) {
      strcpy(buffer,pRVar9->autofile_);
      bVar2 = true;
    }
    pRVar9 = pRVar9 + 1;
  }
  if (!bVar2) {
    bVar5 = false;
    local_ad = 1;
    local_8c = 0;
    for (pbVar10 = filename_vector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __s1 = &local_a8.ext_,
        pbVar10 !=
        filename_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
      pcVar8 = (pbVar10->_M_dataplus)._M_p;
      local_a8.ext_._5_2_ = 0;
      local_a8.ext_._7_1_ = 0;
      local_a8.name_._0_5_ = (undefined5)*(undefined8 *)pcVar8;
      local_a8.ext_._0_1_ = (undefined1)((ulong)*(undefined8 *)(pcVar8 + 5) >> 0x18);
      local_a8.name_._5_3_ = (undefined3)((ulong)*(undefined8 *)pcVar8 >> 0x28);
      local_a8.ext_._1_4_ = (uint)((ulong)*(undefined8 *)(pcVar8 + 5) >> 0x20) & 0xffffff7f;
      local_a8._5_4_ = CONCAT13(local_a8.ext_._0_1_,local_a8.name_._5_3_) & 0x7fffffff;
      iVar6 = strncasecmp((char *)__s1,"bin",3);
      if (((iVar6 == 0) || (iVar6 = strncasecmp((char *)__s1,"bas",3), iVar6 == 0)) ||
         (iVar6 = strncasecmp((char *)__s1,"   ",3), iVar6 == 0)) {
        iVar6 = NbIdenticalCar(pcVar8,disk_filename._M_dataplus._M_p,
                               (int)disk_filename._M_string_length);
        if ((pcVar8[8] == 'B') &&
           (((pcVar8[9] == 'I' && (pcVar8[10] == 'N')) ||
            ((pcVar8[9] == 'A' && (pcVar8[10] == 'S')))))) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (((((local_8c == 0 || local_8c < iVar6) || ((local_ad != 0 && (-1 < pcVar8[9])))) ||
             ((bool)(!bVar5 & bVar1))) && ((local_ad != 0 || (-1 < pcVar8[9])))) &&
           ((bVar1 || (!bVar5)))) {
          local_ad = (byte)pcVar8[9] >> 7;
          sprintf(buffer,"%8.8s",pcVar8);
          for (uVar7 = 7;
              (local_8c = iVar6, bVar5 = bVar1, -1 < (int)uVar7 && (buffer[uVar7] == ' '));
              uVar7 = uVar7 - 1) {
            buffer[uVar7] = '\0';
          }
        }
      }
    }
  }
  if ((bVar2) || (*buffer != '\0')) {
    ret = AUTO_FILE;
  }
  AVar4 = ret;
  std::vector<Rule,_std::allocator<Rule>_>::~vector(&rule_list);
  std::__cxx11::string::~string((string *)&disk_filename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filename_vector);
  return AVar4;
}

Assistant:

IDisk::AutorunType DiskGen::GetAutorun(char* buffer, unsigned int size_of_buffer)
{
   IDisk::AutorunType ret;
   bool end = false;
   int nb_correct_char = 0;
   bool correct_hidden = 1;

   std::vector<std::string> filename_vector = disk_->GetCAT(ret);

   // Get disk name
   std::string disk_filename = GetCurrentLoadedDisk();

   // Specific rules : for specific disks !
   //todo

   // Generic Rules
   class Rule
   {
   public:
      Rule(const char* name, const char* ext, const char* autofile) : name_(name), ext_(ext), autofile_(autofile)
      {
      }

      const char* name_;
      const char* ext_;
      const char* autofile_;
   };

   std::vector<Rule> rule_list;
   rule_list.push_back(Rule("disc", "bin", "DISC"));
   rule_list.push_back(Rule("disk", "bin", "DISK"));
   rule_list.push_back(Rule("disc", "bas", "DISC"));
   rule_list.push_back(Rule("disk", "bas", "DISK"));
   rule_list.push_back(Rule("elite", "bin", "ELITE"));
   rule_list.push_back(Rule("elite", "bas", "ELITE"));
   rule_list.push_back(Rule("ubi", "bin", "UBI"));
   rule_list.push_back(Rule("ubi", "bas", "UBI"));
   rule_list.push_back(Rule("ubi", "", "UBI"));
   rule_list.push_back(Rule("ere", "bin", "ERE.BAS"));
   rule_list.push_back(Rule("ere", "bas", "ERE.BAS"));
   rule_list.push_back(Rule("mbc", "bin", "MBC"));
   rule_list.push_back(Rule("mbc", "bas", "MBC"));
   rule_list.push_back(Rule("esat", "bas", "ESAT"));
   rule_list.push_back(Rule("esat", "bin", "ESAT"));
   rule_list.push_back(Rule("esat", "", "ESAT"));
   rule_list.push_back(Rule("jeu", "bin", "JEU"));
   rule_list.push_back(Rule("jeu", "bas", "JEU"));

   for (auto it = rule_list.begin(); it != rule_list.end() && (end == false); it++)
   {
      if (FindName(filename_vector, it->name_, it->ext_))
      {
         strcpy(buffer, it->autofile_);
         end = true;
      }
   }

   // Other rules
   bool ext_binbas = false;

   if (end == false)
   {
      for (auto it = filename_vector.begin(); it != filename_vector.end(); it++)
      {
         unsigned char filename[16] = {0};
         memcpy(filename, it->c_str(), 13);
         filename[9] = filename[9] & 0x7F; // READ ONLY
         filename[8] = filename[8] & 0x7F; // HIDDEN / SYSTEM
         bool bnewbinbas = false;
         if (strnicmp((char*)&filename[8], "bin", 3) == 0
            || strnicmp((char*)&filename[8], "bas", 3) == 0
            || strnicmp((char*)&filename[8], "   ", 3) == 0)
         {
            // Priority : If it's call "sav?????.b??", it's less priority thant any other
            int nbcar = NbIdenticalCar(it->c_str(), disk_filename.c_str(), disk_filename.size());
            if (strncmp(&it->c_str()[8], "BIN", 3) == 0
               || strncmp(&it->c_str()[8], "BAS", 3) == 0
            )
               bnewbinbas = true;
            if (nbcar > nb_correct_char || nb_correct_char == 0 || (correct_hidden == true && ((it->c_str()[9] & 0x80)
               == 0)) || (bnewbinbas == true && ext_binbas == false))
            {
               if (correct_hidden == false && (it->c_str()[9] & 0x80) == 0x80)
               {
               }
               else if (bnewbinbas == false && ext_binbas == true)
               {
               }
               else
               {
                  // Update return;
                  nb_correct_char = nbcar;
                  ext_binbas = bnewbinbas;

                  correct_hidden = it->c_str()[9] & 0x80;
                  sprintf(buffer, "%8.8s", it->c_str() /*, (char*)&pTrackData[offset+8]*/);
                  for (int i = 7; i >= 0; i--)
                  {
                     if (buffer[i] == 0x20) buffer[i] = 0x00;
                     else break;
                  }
               }
            }
         }
      }
   }

   if (end || strlen(buffer) > 0)
      ret = IDisk::AUTO_FILE;

   return ret;
}